

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceSwapFieldTest_ReflectionSwapFieldOneofFieldDescriptorTest_Test::
~NoFieldPresenceSwapFieldTest_ReflectionSwapFieldOneofFieldDescriptorTest_Test
          (NoFieldPresenceSwapFieldTest_ReflectionSwapFieldOneofFieldDescriptorTest_Test *this)

{
  (this->super_NoFieldPresenceSwapFieldTest).super_Test._vptr_Test =
       (_func_int **)&PTR__NoFieldPresenceSwapFieldTest_018b0668;
  proto2_nofieldpresence_unittest::TestAllTypes::~TestAllTypes
            (&(this->super_NoFieldPresenceSwapFieldTest).m2_);
  proto2_nofieldpresence_unittest::TestAllTypes::~TestAllTypes
            (&(this->super_NoFieldPresenceSwapFieldTest).m1_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x590);
  return;
}

Assistant:

TEST_F(NoFieldPresenceSwapFieldTest,
       ReflectionSwapFieldOneofFieldDescriptorTest) {
  m1_.set_oneof_uint32(1);
  m2_.set_oneof_string("test");

  // NOTE: Calling swap on any field descriptor within the oneof works --
  // even a completely unrelated field.
  const FieldDescriptor* never_set_field = d1_->FindFieldByName("oneof_enum");

  r1_->SwapFields(&m1_, &m2_, /*fields=*/{never_set_field});

  // Fields should be swapped.
  EXPECT_FALSE(r1_->HasField(m1_, never_set_field));
  EXPECT_FALSE(r1_->HasField(m2_, never_set_field));
  EXPECT_TRUE(m1_.has_oneof_string());
  EXPECT_TRUE(m2_.has_oneof_uint32());
  EXPECT_EQ(m1_.oneof_string(), "test");
  EXPECT_EQ(m2_.oneof_uint32(), 1);

  // Calling oneof accessors on a swapped-out field will give the default value.
  EXPECT_FALSE(m1_.has_oneof_uint32());
  EXPECT_FALSE(m2_.has_oneof_string());
  EXPECT_EQ(m1_.oneof_uint32(), 0);
  EXPECT_THAT(m2_.oneof_string(), IsEmpty());
}